

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

void * __thiscall sc_dt::scfx_rep::operator_new(size_t size)

{
  ulong in_RDI;
  scfx_rep *ptr;
  int i;
  int ALLOC_SIZE;
  int local_18;
  undefined8 *local_8;
  
  if (in_RDI == 0x28) {
    if (list == (undefined8 *)0x0) {
      list = (undefined8 *)operator_new__(0xa000);
      for (local_18 = 0; local_18 < 0x3ff; local_18 = local_18 + 1) {
        list[(long)local_18 * 5] = list + (long)local_18 * 5 + 5;
      }
      list[0x13fb] = 0;
    }
    local_8 = list;
    list = (undefined8 *)*list;
  }
  else {
    local_8 = (undefined8 *)::operator_new(in_RDI);
  }
  return local_8;
}

Assistant:

void*
scfx_rep::operator new( std::size_t size )
{
    const int ALLOC_SIZE = 1024;

    if( size != sizeof( scfx_rep ) )
	return ::operator new( size );

    if( ! list )
    {
	list = new scfx_rep_node[ALLOC_SIZE];
	for( int i = 0; i < ALLOC_SIZE - 1; i ++ )
	    list[i].next = list + i + 1;
	list[ALLOC_SIZE - 1].next = 0;
    }

    scfx_rep* ptr = reinterpret_cast<scfx_rep*>( list->data );
    list = list->next;

    return ptr;
}